

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenizer_unittest.cc
# Opt level: O1

void __thiscall
google::protobuf::io::anon_unknown_0::TokenizerTest_SimpleTokens_DD_SimpleTokens_Test::TestBody
          (TokenizerTest_SimpleTokens_DD_SimpleTokens_Test *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *lhs;
  int block_size;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  _Var1;
  bool bVar2;
  long lVar3;
  internal *piVar4;
  char *pcVar5;
  char *in_R9;
  long lVar6;
  int *piVar7;
  string_view src;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  ScopedTrace gtest_trace_225;
  TestInputStream input;
  TestErrorCollector error_collector;
  Tokenizer tokenizer;
  long *local_1a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_198;
  undefined1 local_190 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_188;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_180;
  AssertHelper local_170;
  ScopedTrace local_161;
  AssertHelper local_160;
  long local_158;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_150;
  ArrayInputStream local_148;
  undefined4 local_128;
  TokenType *local_120;
  TestErrorCollector local_118;
  undefined1 local_f0 [40];
  int local_c8;
  int local_c4;
  int local_c0 [36];
  
  lVar3 = 0;
  do {
    piVar4 = (internal *)&io::(anonymous_namespace)::kSimpleTokenCases;
    lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          (&io::(anonymous_namespace)::kSimpleTokenCases + lVar3 * 5);
    local_120 = (TokenType *)(&DAT_01a03b90 + lVar3 * 0x28);
    piVar7 = &io::(anonymous_namespace)::kBlockSizes;
    lVar6 = 0;
    local_158 = lVar3;
    do {
      testing::Message::Message((Message *)&local_150);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_150._M_head_impl + 0x10),"kSimpleTokenCases case #",0x18);
      std::ostream::operator<<(local_150._M_head_impl + 0x10,(int)local_158);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_150._M_head_impl + 0x10),": ",2);
      _Var1._M_head_impl = local_150._M_head_impl;
      src._M_str = (char *)piVar4;
      src._M_len = (size_t)(lhs->_M_dataplus)._M_p;
      absl::lts_20250127::CEscape_abi_cxx11_
                ((string *)local_f0,*(lts_20250127 **)(&DAT_01a03b78 + lVar3 * 10),src);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(_Var1._M_head_impl + 0x10),(char *)local_f0._0_8_,local_f0._8_8_);
      if ((undefined1 *)local_f0._0_8_ != local_f0 + 0x10) {
        operator_delete((void *)local_f0._0_8_,local_f0._16_8_ + 1);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_150._M_head_impl + 0x10),", ",2);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_150._M_head_impl + 0x10),"kBlockSizes case #",0x12);
      std::ostream::operator<<(local_150._M_head_impl + 0x10,(int)lVar6);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_150._M_head_impl + 0x10),": ",2);
      block_size = *piVar7;
      std::ostream::operator<<(local_150._M_head_impl + 0x10,block_size);
      testing::ScopedTrace::ScopedTrace<testing::Message>
                (&local_161,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/tokenizer_unittest.cc"
                 ,0xe1,(Message *)&local_150);
      if (local_150._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(undefined **)local_150._M_head_impl + 8))();
      }
      local_150._M_head_impl =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           &PTR__TestInputStream_01949db8;
      ArrayInputStream::ArrayInputStream
                (&local_148,(lhs->_M_dataplus)._M_p,(&DAT_01a03b78)[lVar3 * 10],block_size);
      local_128 = 0;
      local_118.super_ErrorCollector._vptr_ErrorCollector =
           (_func_int **)&PTR__TestErrorCollector_01949e18;
      local_118.text_._M_dataplus._M_p = (pointer)&local_118.text_.field_2;
      local_118.text_._M_string_length = 0;
      local_118.text_.field_2._M_local_buf[0] = '\0';
      Tokenizer::Tokenizer
                ((Tokenizer *)local_f0,(ZeroCopyInputStream *)&local_150,
                 &local_118.super_ErrorCollector);
      local_1a0 = (long *)((ulong)local_1a0 & 0xffffffff00000000);
      testing::internal::
      CmpHelperEQ<google::protobuf::io::Tokenizer::TokenType,google::protobuf::io::Tokenizer::TokenType>
                ((internal *)local_190,"Tokenizer::TYPE_START","tokenizer.current().type",
                 (TokenType *)&local_1a0,(TokenType *)local_f0);
      if (local_190[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_1a0);
        pcVar5 = anon_var_dwarf_a12c75 + 5;
        if (local_188 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar5 = (local_188->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_170,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/tokenizer_unittest.cc"
                   ,0xe9,pcVar5);
        testing::internal::AssertHelper::operator=(&local_170,(Message *)&local_1a0);
        testing::internal::AssertHelper::~AssertHelper(&local_170);
        if (local_1a0 != (long *)0x0) {
          (**(code **)(*local_1a0 + 8))();
        }
      }
      if (local_188 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_188,local_188);
      }
      testing::internal::CmpHelperEQ<char[1],std::__cxx11::string>
                ((internal *)local_190,"\"\"","tokenizer.current().text",
                 (char (*) [1])(anon_var_dwarf_a12c75 + 5),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_f0 + 8)
                );
      if (local_190[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_1a0);
        pcVar5 = anon_var_dwarf_a12c75 + 5;
        if (local_188 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar5 = (local_188->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_170,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/tokenizer_unittest.cc"
                   ,0xea,pcVar5);
        testing::internal::AssertHelper::operator=(&local_170,(Message *)&local_1a0);
        testing::internal::AssertHelper::~AssertHelper(&local_170);
        if (local_1a0 != (long *)0x0) {
          (**(code **)(*local_1a0 + 8))();
        }
      }
      if (local_188 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_188,local_188);
      }
      local_1a0 = (long *)((ulong)local_1a0 & 0xffffffff00000000);
      testing::internal::CmpHelperEQ<int,int>
                ((internal *)local_190,"0","tokenizer.current().line",(int *)&local_1a0,&local_c8);
      if (local_190[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_1a0);
        pcVar5 = anon_var_dwarf_a12c75 + 5;
        if (local_188 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar5 = (local_188->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_170,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/tokenizer_unittest.cc"
                   ,0xeb,pcVar5);
        testing::internal::AssertHelper::operator=(&local_170,(Message *)&local_1a0);
        testing::internal::AssertHelper::~AssertHelper(&local_170);
        if (local_1a0 != (long *)0x0) {
          (**(code **)(*local_1a0 + 8))();
        }
      }
      if (local_188 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_188,local_188);
      }
      local_1a0 = (long *)((ulong)local_1a0 & 0xffffffff00000000);
      testing::internal::CmpHelperEQ<int,int>
                ((internal *)local_190,"0","tokenizer.current().column",(int *)&local_1a0,&local_c4)
      ;
      if (local_190[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_1a0);
        pcVar5 = anon_var_dwarf_a12c75 + 5;
        if (local_188 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar5 = (local_188->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_170,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/tokenizer_unittest.cc"
                   ,0xec,pcVar5);
        testing::internal::AssertHelper::operator=(&local_170,(Message *)&local_1a0);
        testing::internal::AssertHelper::~AssertHelper(&local_170);
        if (local_1a0 != (long *)0x0) {
          (**(code **)(*local_1a0 + 8))();
        }
      }
      if (local_188 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_188,local_188);
      }
      local_1a0 = (long *)((ulong)local_1a0 & 0xffffffff00000000);
      testing::internal::CmpHelperEQ<int,int>
                ((internal *)local_190,"0","tokenizer.current().end_column",(int *)&local_1a0,
                 local_c0);
      if (local_190[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_1a0);
        pcVar5 = anon_var_dwarf_a12c75 + 5;
        if (local_188 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar5 = (local_188->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_170,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/tokenizer_unittest.cc"
                   ,0xed,pcVar5);
        testing::internal::AssertHelper::operator=(&local_170,(Message *)&local_1a0);
        testing::internal::AssertHelper::~AssertHelper(&local_170);
        if (local_1a0 != (long *)0x0) {
          (**(code **)(*local_1a0 + 8))();
        }
      }
      if (local_188 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_188,local_188);
      }
      bVar2 = Tokenizer::Next((Tokenizer *)local_f0);
      local_1a0 = (long *)CONCAT71(local_1a0._1_7_,bVar2);
      local_198 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (bVar2) {
LAB_00b45856:
        testing::internal::
        CmpHelperEQ<google::protobuf::io::Tokenizer::TokenType,google::protobuf::io::Tokenizer::TokenType>
                  ((internal *)local_190,"kSimpleTokenCases_case.type","tokenizer.current().type",
                   local_120,(TokenType *)local_f0);
        if (local_190[0] == (internal)0x0) {
          testing::Message::Message((Message *)&local_1a0);
          pcVar5 = anon_var_dwarf_a12c75 + 5;
          if (local_188 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            pcVar5 = (local_188->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_170,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/tokenizer_unittest.cc"
                     ,0xf3,pcVar5);
          testing::internal::AssertHelper::operator=(&local_170,(Message *)&local_1a0);
          testing::internal::AssertHelper::~AssertHelper(&local_170);
          if (local_1a0 != (long *)0x0) {
            (**(code **)(*local_1a0 + 8))();
          }
        }
        if (local_188 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_188,local_188);
        }
        testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
                  ((internal *)local_190,"kSimpleTokenCases_case.input","tokenizer.current().text",
                   lhs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (local_f0 + 8));
        if (local_190[0] == (internal)0x0) {
          testing::Message::Message((Message *)&local_1a0);
          pcVar5 = anon_var_dwarf_a12c75 + 5;
          if (local_188 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            pcVar5 = (local_188->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_170,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/tokenizer_unittest.cc"
                     ,0xf5,pcVar5);
          testing::internal::AssertHelper::operator=(&local_170,(Message *)&local_1a0);
          testing::internal::AssertHelper::~AssertHelper(&local_170);
          if (local_1a0 != (long *)0x0) {
            (**(code **)(*local_1a0 + 8))();
          }
        }
        if (local_188 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_188,local_188);
        }
        local_1a0 = (long *)((ulong)local_1a0 & 0xffffffff00000000);
        testing::internal::CmpHelperEQ<int,int>
                  ((internal *)local_190,"0","tokenizer.current().line",(int *)&local_1a0,&local_c8)
        ;
        if (local_190[0] == (internal)0x0) {
          testing::Message::Message((Message *)&local_1a0);
          pcVar5 = anon_var_dwarf_a12c75 + 5;
          if (local_188 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            pcVar5 = (local_188->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_170,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/tokenizer_unittest.cc"
                     ,0xf7,pcVar5);
          testing::internal::AssertHelper::operator=(&local_170,(Message *)&local_1a0);
          testing::internal::AssertHelper::~AssertHelper(&local_170);
          if (local_1a0 != (long *)0x0) {
            (**(code **)(*local_1a0 + 8))();
          }
        }
        if (local_188 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_188,local_188);
        }
        local_1a0 = (long *)((ulong)local_1a0 & 0xffffffff00000000);
        testing::internal::CmpHelperEQ<int,int>
                  ((internal *)local_190,"0","tokenizer.current().column",(int *)&local_1a0,
                   &local_c4);
        if (local_190[0] == (internal)0x0) {
          testing::Message::Message((Message *)&local_1a0);
          pcVar5 = anon_var_dwarf_a12c75 + 5;
          if (local_188 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            pcVar5 = (local_188->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_170,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/tokenizer_unittest.cc"
                     ,0xf8,pcVar5);
          testing::internal::AssertHelper::operator=(&local_170,(Message *)&local_1a0);
          testing::internal::AssertHelper::~AssertHelper(&local_170);
          if (local_1a0 != (long *)0x0) {
            (**(code **)(*local_1a0 + 8))();
          }
        }
        if (local_188 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_188,local_188);
        }
        local_1a0 = *(long **)(&DAT_01a03b78 + lVar3 * 10);
        testing::internal::CmpHelperEQ<unsigned_long,int>
                  ((internal *)local_190,"kSimpleTokenCases_case.input.size()",
                   "tokenizer.current().end_column",(unsigned_long *)&local_1a0,local_c0);
        if (local_190[0] == (internal)0x0) {
          testing::Message::Message((Message *)&local_1a0);
          pcVar5 = anon_var_dwarf_a12c75 + 5;
          if (local_188 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            pcVar5 = (local_188->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_170,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/tokenizer_unittest.cc"
                     ,0xfa,pcVar5);
          testing::internal::AssertHelper::operator=(&local_170,(Message *)&local_1a0);
          testing::internal::AssertHelper::~AssertHelper(&local_170);
          if (local_1a0 != (long *)0x0) {
            (**(code **)(*local_1a0 + 8))();
          }
        }
        if (local_188 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_188,local_188);
        }
        bVar2 = Tokenizer::Next((Tokenizer *)local_f0);
        local_1a0 = (long *)CONCAT71(local_1a0._1_7_,!bVar2);
        local_198 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        if (bVar2) {
          testing::Message::Message((Message *)&local_170);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)local_190,(internal *)&local_1a0,
                     (AssertionResult *)"tokenizer.Next()","true","false",in_R9);
          testing::internal::AssertHelper::AssertHelper
                    (&local_160,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/tokenizer_unittest.cc"
                     ,0xfd,(char *)CONCAT71(local_190._1_7_,local_190[0]));
          testing::internal::AssertHelper::operator=(&local_160,(Message *)&local_170);
          testing::internal::AssertHelper::~AssertHelper(&local_160);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT71(local_190._1_7_,local_190[0]) != &local_180) {
            operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)CONCAT71(local_190._1_7_,local_190[0]),
                            local_180._M_allocated_capacity + 1);
          }
          if (local_170.data_ != (AssertHelperData *)0x0) {
            (**(code **)(*(long *)local_170.data_ + 8))();
          }
        }
        if (local_198 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_198,local_198);
        }
        local_1a0 = (long *)CONCAT44(local_1a0._4_4_,1);
        testing::internal::
        CmpHelperEQ<google::protobuf::io::Tokenizer::TokenType,google::protobuf::io::Tokenizer::TokenType>
                  ((internal *)local_190,"Tokenizer::TYPE_END","tokenizer.current().type",
                   (TokenType *)&local_1a0,(TokenType *)local_f0);
        if (local_190[0] == (internal)0x0) {
          testing::Message::Message((Message *)&local_1a0);
          pcVar5 = anon_var_dwarf_a12c75 + 5;
          if (local_188 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            pcVar5 = (local_188->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_170,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/tokenizer_unittest.cc"
                     ,0x100,pcVar5);
          testing::internal::AssertHelper::operator=(&local_170,(Message *)&local_1a0);
          testing::internal::AssertHelper::~AssertHelper(&local_170);
          if (local_1a0 != (long *)0x0) {
            (**(code **)(*local_1a0 + 8))();
          }
        }
        if (local_188 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_188,local_188);
        }
        testing::internal::CmpHelperEQ<char[1],std::__cxx11::string>
                  ((internal *)local_190,"\"\"","tokenizer.current().text",
                   (char (*) [1])(anon_var_dwarf_a12c75 + 5),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_f0 + 8));
        if (local_190[0] == (internal)0x0) {
          testing::Message::Message((Message *)&local_1a0);
          pcVar5 = anon_var_dwarf_a12c75 + 5;
          if (local_188 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            pcVar5 = (local_188->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_170,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/tokenizer_unittest.cc"
                     ,0x101,pcVar5);
          testing::internal::AssertHelper::operator=(&local_170,(Message *)&local_1a0);
          testing::internal::AssertHelper::~AssertHelper(&local_170);
          if (local_1a0 != (long *)0x0) {
            (**(code **)(*local_1a0 + 8))();
          }
        }
        if (local_188 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_188,local_188);
        }
        local_1a0 = (long *)((ulong)local_1a0 & 0xffffffff00000000);
        testing::internal::CmpHelperEQ<int,int>
                  ((internal *)local_190,"0","tokenizer.current().line",(int *)&local_1a0,&local_c8)
        ;
        if (local_190[0] == (internal)0x0) {
          testing::Message::Message((Message *)&local_1a0);
          pcVar5 = anon_var_dwarf_a12c75 + 5;
          if (local_188 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            pcVar5 = (local_188->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_170,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/tokenizer_unittest.cc"
                     ,0x102,pcVar5);
          testing::internal::AssertHelper::operator=(&local_170,(Message *)&local_1a0);
          testing::internal::AssertHelper::~AssertHelper(&local_170);
          if (local_1a0 != (long *)0x0) {
            (**(code **)(*local_1a0 + 8))();
          }
        }
        if (local_188 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_188,local_188);
        }
        local_1a0 = *(long **)(&DAT_01a03b78 + lVar3 * 10);
        testing::internal::CmpHelperEQ<unsigned_long,int>
                  ((internal *)local_190,"kSimpleTokenCases_case.input.size()",
                   "tokenizer.current().column",(unsigned_long *)&local_1a0,&local_c4);
        if (local_190[0] == (internal)0x0) {
          testing::Message::Message((Message *)&local_1a0);
          pcVar5 = anon_var_dwarf_a12c75 + 5;
          if (local_188 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            pcVar5 = (local_188->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_170,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/tokenizer_unittest.cc"
                     ,0x103,pcVar5);
          testing::internal::AssertHelper::operator=(&local_170,(Message *)&local_1a0);
          testing::internal::AssertHelper::~AssertHelper(&local_170);
          if (local_1a0 != (long *)0x0) {
            (**(code **)(*local_1a0 + 8))();
          }
        }
        if (local_188 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_188,local_188);
        }
        local_1a0 = *(long **)(&DAT_01a03b78 + lVar3 * 10);
        piVar4 = (internal *)&local_1a0;
        testing::internal::CmpHelperEQ<unsigned_long,int>
                  ((internal *)local_190,"kSimpleTokenCases_case.input.size()",
                   "tokenizer.current().end_column",(unsigned_long *)&local_1a0,local_c0);
        if (local_190[0] == (internal)0x0) {
          testing::Message::Message((Message *)&local_1a0);
          pcVar5 = anon_var_dwarf_a12c75 + 5;
          if (local_188 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            pcVar5 = (local_188->_M_dataplus)._M_p;
          }
          piVar4 = (internal *)0x105;
          testing::internal::AssertHelper::AssertHelper
                    (&local_170,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/tokenizer_unittest.cc"
                     ,0x105,pcVar5);
          testing::internal::AssertHelper::operator=(&local_170,(Message *)&local_1a0);
          testing::internal::AssertHelper::~AssertHelper(&local_170);
          if (local_1a0 != (long *)0x0) {
            (**(code **)(*local_1a0 + 8))();
          }
        }
        if (local_188 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_188,local_188);
        }
        local_1a0 = (long *)CONCAT71(local_1a0._1_7_,local_118.text_._M_string_length == 0);
        local_198 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        if (local_118.text_._M_string_length != 0) {
          testing::Message::Message((Message *)&local_170);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)local_190,(internal *)&local_1a0,
                     (AssertionResult *)"error_collector.text_.empty()","false","true",in_R9);
          piVar4 = (internal *)0x108;
          testing::internal::AssertHelper::AssertHelper
                    (&local_160,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/tokenizer_unittest.cc"
                     ,0x108,(char *)CONCAT71(local_190._1_7_,local_190[0]));
          testing::internal::AssertHelper::operator=(&local_160,(Message *)&local_170);
          testing::internal::AssertHelper::~AssertHelper(&local_160);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT71(local_190._1_7_,local_190[0]) != &local_180) {
            operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)CONCAT71(local_190._1_7_,local_190[0]),
                            local_180._M_allocated_capacity + 1);
          }
          if (local_170.data_ != (AssertHelperData *)0x0) {
            (**(code **)(*(long *)local_170.data_ + 8))();
          }
        }
        if (local_198 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_198,local_198);
        }
      }
      else {
        testing::Message::Message((Message *)&local_170);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_190,(internal *)&local_1a0,(AssertionResult *)"tokenizer.Next()",
                   "false","true",in_R9);
        piVar4 = (internal *)&DAT_000000f0;
        testing::internal::AssertHelper::AssertHelper
                  (&local_160,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/tokenizer_unittest.cc"
                   ,0xf0,(char *)CONCAT71(local_190._1_7_,local_190[0]));
        testing::internal::AssertHelper::operator=(&local_160,(Message *)&local_170);
        testing::internal::AssertHelper::~AssertHelper(&local_160);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT71(local_190._1_7_,local_190[0]) != &local_180) {
          operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)CONCAT71(local_190._1_7_,local_190[0]),
                          local_180._M_allocated_capacity + 1);
        }
        if (local_170.data_ != (AssertHelperData *)0x0) {
          (**(code **)(*(long *)local_170.data_ + 8))();
        }
        if (local_198 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_198,local_198);
        }
        if (bVar2) goto LAB_00b45856;
      }
      Tokenizer::~Tokenizer((Tokenizer *)local_f0);
      TestErrorCollector::~TestErrorCollector(&local_118);
      testing::ScopedTrace::~ScopedTrace(&local_161);
      lVar6 = lVar6 + 1;
      piVar7 = piVar7 + 1;
    } while (lVar6 != 8);
    lVar3 = local_158 + 1;
    if (lVar3 == 0x1e) {
      return;
    }
  } while( true );
}

Assistant:

TEST_2D(TokenizerTest, SimpleTokens, kSimpleTokenCases, kBlockSizes) {
  // Set up the tokenizer.
  TestInputStream input(kSimpleTokenCases_case.input.data(),
                        kSimpleTokenCases_case.input.size(), kBlockSizes_case);
  TestErrorCollector error_collector;
  Tokenizer tokenizer(&input, &error_collector);

  // Before Next() is called, the initial token should always be TYPE_START.
  EXPECT_EQ(Tokenizer::TYPE_START, tokenizer.current().type);
  EXPECT_EQ("", tokenizer.current().text);
  EXPECT_EQ(0, tokenizer.current().line);
  EXPECT_EQ(0, tokenizer.current().column);
  EXPECT_EQ(0, tokenizer.current().end_column);

  // Parse the token.
  ASSERT_TRUE(tokenizer.Next());

  // Check that it has the right type.
  EXPECT_EQ(kSimpleTokenCases_case.type, tokenizer.current().type);
  // Check that it contains the complete input text.
  EXPECT_EQ(kSimpleTokenCases_case.input, tokenizer.current().text);
  // Check that it is located at the beginning of the input
  EXPECT_EQ(0, tokenizer.current().line);
  EXPECT_EQ(0, tokenizer.current().column);
  EXPECT_EQ(kSimpleTokenCases_case.input.size(),
            tokenizer.current().end_column);

  // There should be no more input.
  EXPECT_FALSE(tokenizer.Next());

  // After Next() returns false, the token should have type TYPE_END.
  EXPECT_EQ(Tokenizer::TYPE_END, tokenizer.current().type);
  EXPECT_EQ("", tokenizer.current().text);
  EXPECT_EQ(0, tokenizer.current().line);
  EXPECT_EQ(kSimpleTokenCases_case.input.size(), tokenizer.current().column);
  EXPECT_EQ(kSimpleTokenCases_case.input.size(),
            tokenizer.current().end_column);

  // There should be no errors.
  EXPECT_TRUE(error_collector.text_.empty());
}